

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O1

bool __thiscall
CLParser::Parse(CLParser *this,string *output,string *deps_prefix,string *filtered_output,
               string *err)

{
  Metrics *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  Metric *pMVar5;
  string normalized;
  string line;
  string include;
  ScopedMetric metrics_h_scoped;
  uint64_t slash_bits;
  string local_120;
  string *local_100;
  string local_f8;
  string local_d8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_b8;
  string *local_b0;
  string local_a8;
  string local_88;
  string local_68;
  ScopedMetric local_48;
  uint64_t local_38;
  
  local_b8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this;
  local_b0 = deps_prefix;
  if ((Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
       ::metrics_h_metric == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar3 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar5 = (Metric *)0x0;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CLParser::Parse","");
      pMVar5 = Metrics::NewMetric(this_00,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    Parse::metrics_h_metric = pMVar5;
    __cxa_guard_release(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_48,Parse::metrics_h_metric);
  local_100 = filtered_output;
  if (output == filtered_output) {
    __assert_fail("&output != filtered_output",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clparser.cc"
                  ,0x55,"bool CLParser::Parse(const string &, const string &, string *, string *)");
  }
  if (output->_M_string_length != 0) {
    bVar1 = false;
    sVar4 = 0;
    do {
      sVar4 = std::__cxx11::string::find_first_of((char *)output,0x127ac8,sVar4);
      if (sVar4 == 0xffffffffffffffff) {
        sVar4 = output->_M_string_length;
      }
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)output);
      FilterShowIncludes(&local_a8,&local_f8,local_b0);
      if (local_a8._M_string_length == 0) {
        if (bVar1) {
          bVar2 = false;
        }
        else {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_f8._M_dataplus._M_p,
                     local_f8._M_dataplus._M_p + local_f8._M_string_length);
          bVar2 = FilterInputFilename(&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2 == false) {
          std::__cxx11::string::_M_append((char *)local_100,(ulong)local_f8._M_dataplus._M_p);
          std::__cxx11::string::append((char *)local_100);
        }
      }
      else {
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        local_120._M_string_length = 0;
        local_120.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)&local_120);
        CanonicalizePath(&local_120,&local_38);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,local_120._M_dataplus._M_p,
                   local_120._M_dataplus._M_p + local_120._M_string_length);
        bVar1 = IsSystemInclude(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (!bVar1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_b8,&local_120);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,
                          CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                   local_120.field_2._M_local_buf[0]) + 1);
        }
        bVar1 = true;
      }
      if (sVar4 < output->_M_string_length) {
        sVar4 = sVar4 + ((output->_M_dataplus)._M_p[sVar4] == '\r');
      }
      if (sVar4 < output->_M_string_length) {
        sVar4 = ((output->_M_dataplus)._M_p[sVar4] == '\n') + sVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    } while (sVar4 < output->_M_string_length);
  }
  ScopedMetric::~ScopedMetric(&local_48);
  return true;
}

Assistant:

bool CLParser::Parse(const string& output, const string& deps_prefix,
                     string* filtered_output, string* err) {
  METRIC_RECORD("CLParser::Parse");

  // Loop over all lines in the output to process them.
  assert(&output != filtered_output);
  size_t start = 0;
  bool seen_show_includes = false;
#ifdef _WIN32
  IncludesNormalize normalizer(".");
#endif

  while (start < output.size()) {
    size_t end = output.find_first_of("\r\n", start);
    if (end == string::npos)
      end = output.size();
    string line = output.substr(start, end - start);

    string include = FilterShowIncludes(line, deps_prefix);
    if (!include.empty()) {
      seen_show_includes = true;
      string normalized;
#ifdef _WIN32
      if (!normalizer.Normalize(include, &normalized, err))
        return false;
#else
      // TODO: should this make the path relative to cwd?
      normalized = include;
      uint64_t slash_bits;
      CanonicalizePath(&normalized, &slash_bits);
#endif
      if (!IsSystemInclude(normalized))
        includes_.insert(normalized);
    } else if (!seen_show_includes && FilterInputFilename(line)) {
      // Drop it.
      // TODO: if we support compiling multiple output files in a single
      // cl.exe invocation, we should stash the filename.
    } else {
      filtered_output->append(line);
      filtered_output->append("\n");
    }

    if (end < output.size() && output[end] == '\r')
      ++end;
    if (end < output.size() && output[end] == '\n')
      ++end;
    start = end;
  }

  return true;
}